

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20>::~TPZManVector
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20> *this)

{
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar1;
  TPZReference *pTVar2;
  long lVar3;
  
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_018506a8;
  if ((this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore ==
      this->fExtAlloc) {
    (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore =
         (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0;
  }
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = 0;
  lVar3 = 0xb8;
  do {
    TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
               ((long)&(((TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20> *)
                        (this->fExtAlloc + -4))->
                       super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                       _vptr_TPZVec + lVar3));
    lVar3 = lVar3 + -8;
  } while (lVar3 != 0x18);
  (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZVec_01850710;
  pTVar1 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore;
  if (pTVar1 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0) {
    pTVar2 = pTVar1[-1].fRef;
    if (pTVar2 != (TPZReference *)0x0) {
      lVar3 = (long)pTVar2 * 8;
      do {
        TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
                  ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                   ((long)&pTVar1[-1].fRef + lVar3));
        lVar3 = lVar3 + -8;
      } while (lVar3 != 0);
    }
    operator_delete__(pTVar1 + -1,(long)pTVar2 * 8 + 8);
    return;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}